

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6522Implementation.hpp
# Opt level: O2

void __thiscall
MOS::MOS6522::
MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)2>::VIAPortHandler>
::shift_out(MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)2>::VIAPortHandler>
            *this)

{
  int *piVar1;
  uint8_t *puVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  
  bVar4 = (this->super_MOS6522Storage).registers_.auxiliary_control & 0x1c;
  if ((bVar4 == 0x10) || ((this->super_MOS6522Storage).shift_bits_remaining_ != 0)) {
    bVar3 = (this->super_MOS6522Storage).registers_.shift;
    bVar5 = bVar3 >> 7;
    if (bVar4 != 0x10) {
      bVar5 = 0;
    }
    (this->super_MOS6522Storage).registers_.shift = bVar5 | bVar3 * '\x02';
    evaluate_cb2_output(this);
    piVar1 = &(this->super_MOS6522Storage).shift_bits_remaining_;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      puVar2 = &(this->super_MOS6522Storage).registers_.interrupt_flags;
      *puVar2 = *puVar2 | 4;
      reevaluate_interrupts(this);
      return;
    }
  }
  return;
}

Assistant:

void MOS6522<T>::shift_out() {
	const bool is_free_running = shift_mode() == ShiftMode::OutUnderT2FreeRunning;
	if(is_free_running || shift_bits_remaining_) {
		// Recirculate bits only if in free-running mode (?)
		const uint8_t incoming_bit = (registers_.shift >> 7) * is_free_running;
		registers_.shift = uint8_t(registers_.shift << 1) | incoming_bit;
		evaluate_cb2_output();

		--shift_bits_remaining_;
		if(!shift_bits_remaining_) {
			registers_.interrupt_flags |= InterruptFlag::ShiftRegister;
			reevaluate_interrupts();
		}
	}
}